

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select_Game.cpp
# Opt level: O0

double __thiscall SelectGame::selectGame_Option(SelectGame *this,double *credits)

{
  pointer *ppvVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  undefined1 local_318 [8];
  Start startGame_4;
  Bet currentBet_4;
  uint bet_4;
  CreditField myCredit_4;
  undefined1 local_2c8 [7];
  PrintGameName printWelcome_4;
  Start startGame_3;
  undefined1 local_288 [8];
  Matrix myMatrix_3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myMatrixVector_3;
  Bet currentBet_3;
  uint bet_3;
  CreditField myCredit_3;
  undefined1 local_230 [7];
  PrintGameName printWelcome_3;
  Start startGame_2;
  undefined1 local_1f0 [8];
  MatrixPharaohs myMatrix_2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myMatrixVector_2;
  Bet currentBet_2;
  uint bet_2;
  CreditField myCredit_2;
  undefined1 local_198 [7];
  PrintGameName printWelcome_2;
  Start startGame_1;
  undefined1 local_158 [8];
  Matrix myMatrix_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myMatrixVector_1;
  Bet currentBet_1;
  uint bet_1;
  CreditField myCredit_1;
  undefined1 local_100 [7];
  PrintGameName printWelcome_1;
  Start startGame;
  undefined1 local_c0 [8];
  Matrix myMatrix;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myMatrixVector;
  Bet currentBet;
  uint bet;
  CreditField myCredit;
  duration<long,_std::ratio<1L,_1L>_> dStack_68;
  PrintGameName printWelcome;
  seconds duration_1;
  seconds duration;
  CreditField addCredit;
  string local_38 [7];
  bool neverExit;
  string option;
  double *credits_local;
  SelectGame *this_local;
  
  option.field_2._8_8_ = credits;
  std::__cxx11::string::string(local_38);
  do {
    selectGame_Welcome(this);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Choose a game which you want to Play!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 1 for SuperFire 5");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 2 for SuperFire 10");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 3 for Wise Pharaohs 5");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 4 for Tiger\'s Battle 10");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 5 for Keno");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press a to add credit!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press c to exit!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Current Credit: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)option.field_2._8_8_);
    poVar3 = std::operator<<(poVar3," Euro!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_38);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if ((*pcVar4 == 'a') && (lVar5 = std::__cxx11::string::size(), lVar5 == 1)) {
      CreditField::CreditField((CreditField *)&duration);
      CreditField::AddCredit((CreditField *)&duration,(double *)option.field_2._8_8_);
      CreditField::~CreditField((CreditField *)&duration);
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if ((*pcVar4 == 'c') && (lVar5 = std::__cxx11::string::size(), lVar5 == 1)) {
      if (*(double *)option.field_2._8_8_ <= 0.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Nothing to cashout!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        dStack_68.__r = 3;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&stack0xffffffffffffff98);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Cashout...");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)option.field_2._8_8_);
        poVar3 = std::operator<<(poVar3," Euro!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        duration_1.__r = 3;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&duration_1);
        *(undefined8 *)option.field_2._8_8_ = 0;
      }
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if ((*pcVar4 == '1') && (lVar5 = std::__cxx11::string::size(), lVar5 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName((PrintGameName *)((long)&myCredit._credit + 7));
      PrintGameName::PrintGameNameWelcome((PrintGameName *)((long)&myCredit._credit + 7));
      if (*(double *)option.field_2._8_8_ <= 1.0 && *(double *)option.field_2._8_8_ != 1.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        CreditField::CreditField((CreditField *)&stack0xffffffffffffff88);
        CreditField::AddCredit
                  ((CreditField *)&stack0xffffffffffffff88,(double *)option.field_2._8_8_);
        CreditField::~CreditField((CreditField *)&stack0xffffffffffffff88);
      }
      currentBet._credit_bet._4_4_ = 0;
      Bet::Bet((Bet *)&myMatrixVector.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
               *(double *)option.field_2._8_8_);
      Bet::selectBet((Bet *)&myMatrixVector.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (uint *)((long)&currentBet._credit_bet + 4),(double *)option.field_2._8_8_);
      ppvVar1 = &myMatrix._matrixVec.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)ppvVar1);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&startGame._bet,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)ppvVar1);
      Matrix::Matrix((Matrix *)local_c0,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&startGame._bet);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&startGame._bet);
      Start::Start((Start *)local_100,*(double *)option.field_2._8_8_,currentBet._credit_bet._4_4_);
      Start::StartGameNow((Start *)local_100,(double *)option.field_2._8_8_,
                          (uint *)((long)&currentBet._credit_bet + 4));
      Start::~Start((Start *)local_100);
      Matrix::~Matrix((Matrix *)local_c0);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&myMatrix._matrixVec.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Bet::~Bet((Bet *)&myMatrixVector.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      PrintGameName::~PrintGameName((PrintGameName *)((long)&myCredit._credit + 7));
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if ((*pcVar4 == '2') && (lVar5 = std::__cxx11::string::size(), lVar5 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName((PrintGameName *)((long)&myCredit_1._credit + 7));
      PrintGameName::PrintGameNameWelcomeSuperFire10
                ((PrintGameName *)((long)&myCredit_1._credit + 7));
      if (*(double *)option.field_2._8_8_ <= 2.0 && *(double *)option.field_2._8_8_ != 2.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        CreditField::CreditField((CreditField *)&stack0xfffffffffffffef0);
        CreditField::AddCredit
                  ((CreditField *)&stack0xfffffffffffffef0,(double *)option.field_2._8_8_);
        CreditField::~CreditField((CreditField *)&stack0xfffffffffffffef0);
      }
      currentBet_1._credit_bet._4_4_ = 0;
      Bet::Bet((Bet *)&myMatrixVector_1.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
               *(double *)option.field_2._8_8_);
      Bet::selectBetSuperFire10
                ((Bet *)&myMatrixVector_1.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (uint *)((long)&currentBet_1._credit_bet + 4),(double *)option.field_2._8_8_);
      ppvVar1 = &myMatrix_1._matrixVec.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)ppvVar1);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&startGame_1._bet,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)ppvVar1);
      Matrix::Matrix((Matrix *)local_158,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&startGame_1._bet);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&startGame_1._bet);
      Start::Start((Start *)local_198,*(double *)option.field_2._8_8_,currentBet_1._credit_bet._4_4_
                  );
      Start::StartGameNowSuperFire10
                ((Start *)local_198,(double *)option.field_2._8_8_,
                 (uint *)((long)&currentBet_1._credit_bet + 4));
      Start::~Start((Start *)local_198);
      Matrix::~Matrix((Matrix *)local_158);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&myMatrix_1._matrixVec.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Bet::~Bet((Bet *)&myMatrixVector_1.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      PrintGameName::~PrintGameName((PrintGameName *)((long)&myCredit_1._credit + 7));
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if ((*pcVar4 == '3') && (lVar5 = std::__cxx11::string::size(), lVar5 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName((PrintGameName *)((long)&myCredit_2._credit + 7));
      PrintGameName::PrintGameNameWelcomeWisePharaohs5
                ((PrintGameName *)((long)&myCredit_2._credit + 7));
      if (*(double *)option.field_2._8_8_ <= 1.0 && *(double *)option.field_2._8_8_ != 1.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        CreditField::CreditField((CreditField *)&stack0xfffffffffffffe58);
        CreditField::AddCredit
                  ((CreditField *)&stack0xfffffffffffffe58,(double *)option.field_2._8_8_);
        CreditField::~CreditField((CreditField *)&stack0xfffffffffffffe58);
      }
      currentBet_2._credit_bet._4_4_ = 0;
      Bet::Bet((Bet *)&myMatrixVector_2.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
               *(double *)option.field_2._8_8_);
      Bet::selectBetWisePharaohs
                ((Bet *)&myMatrixVector_2.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (uint *)((long)&currentBet_2._credit_bet + 4),(double *)option.field_2._8_8_);
      ppvVar1 = &myMatrix_2._matrixVec.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)ppvVar1);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&startGame_2._bet,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)ppvVar1);
      MatrixPharaohs::MatrixPharaohs
                ((MatrixPharaohs *)local_1f0,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&startGame_2._bet);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&startGame_2._bet);
      Start::Start((Start *)local_230,*(double *)option.field_2._8_8_,currentBet_2._credit_bet._4_4_
                  );
      Start::StartGameNowWisePharaohs5
                ((Start *)local_230,(double *)option.field_2._8_8_,
                 (uint *)((long)&currentBet_2._credit_bet + 4));
      Start::~Start((Start *)local_230);
      MatrixPharaohs::~MatrixPharaohs((MatrixPharaohs *)local_1f0);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&myMatrix_2._matrixVec.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Bet::~Bet((Bet *)&myMatrixVector_2.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      PrintGameName::~PrintGameName((PrintGameName *)((long)&myCredit_2._credit + 7));
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if ((*pcVar4 == '4') && (lVar5 = std::__cxx11::string::size(), lVar5 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName((PrintGameName *)((long)&myCredit_3._credit + 7));
      PrintGameName::PrintGameNameWelcomeTigersBattle10
                ((PrintGameName *)((long)&myCredit_3._credit + 7));
      if (*(double *)option.field_2._8_8_ <= 2.0 && *(double *)option.field_2._8_8_ != 2.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        CreditField::CreditField((CreditField *)&stack0xfffffffffffffdc0);
        CreditField::AddCredit
                  ((CreditField *)&stack0xfffffffffffffdc0,(double *)option.field_2._8_8_);
        CreditField::~CreditField((CreditField *)&stack0xfffffffffffffdc0);
      }
      currentBet_3._credit_bet._4_4_ = 0;
      Bet::Bet((Bet *)&myMatrixVector_3.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
               *(double *)option.field_2._8_8_);
      Bet::selectBetTigersBattle10
                ((Bet *)&myMatrixVector_3.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (uint *)((long)&currentBet_3._credit_bet + 4),(double *)option.field_2._8_8_);
      ppvVar1 = &myMatrix_3._matrixVec.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)ppvVar1);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&startGame_3._bet,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)ppvVar1);
      Matrix::Matrix((Matrix *)local_288,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&startGame_3._bet);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&startGame_3._bet);
      Start::Start((Start *)local_2c8,*(double *)option.field_2._8_8_,currentBet_3._credit_bet._4_4_
                  );
      Start::StartGameNowTigersBattle10
                ((Start *)local_2c8,(double *)option.field_2._8_8_,
                 (uint *)((long)&currentBet_3._credit_bet + 4));
      Start::~Start((Start *)local_2c8);
      Matrix::~Matrix((Matrix *)local_288);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&myMatrix_3._matrixVec.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Bet::~Bet((Bet *)&myMatrixVector_3.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      PrintGameName::~PrintGameName((PrintGameName *)((long)&myCredit_3._credit + 7));
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if ((*pcVar4 == '5') && (lVar5 = std::__cxx11::string::size(), lVar5 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName((PrintGameName *)((long)&myCredit_4._credit + 7));
      PrintGameName::PrintGameNameWelcomeKeno((PrintGameName *)((long)&myCredit_4._credit + 7));
      if (*(double *)option.field_2._8_8_ <= 1.0 && *(double *)option.field_2._8_8_ != 1.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        CreditField::CreditField((CreditField *)&stack0xfffffffffffffd28);
        CreditField::AddCredit
                  ((CreditField *)&stack0xfffffffffffffd28,(double *)option.field_2._8_8_);
        CreditField::~CreditField((CreditField *)&stack0xfffffffffffffd28);
      }
      currentBet_4._credit_bet._4_4_ = 0;
      Bet::Bet((Bet *)&startGame_4._bet,0,*(double *)option.field_2._8_8_);
      Bet::selectBetKeno((Bet *)&startGame_4._bet,(uint *)((long)&currentBet_4._credit_bet + 4),
                         (double *)option.field_2._8_8_);
      Start::Start((Start *)local_318,*(double *)option.field_2._8_8_,currentBet_4._credit_bet._4_4_
                  );
      Start::StartGameNowKeno
                ((Start *)local_318,(double *)option.field_2._8_8_,
                 (uint *)((long)&currentBet_4._credit_bet + 4));
      Start::~Start((Start *)local_318);
      Bet::~Bet((Bet *)&startGame_4._bet);
      PrintGameName::~PrintGameName((PrintGameName *)((long)&myCredit_4._credit + 7));
    }
  } while( true );
}

Assistant:

double SelectGame::selectGame_Option(double & credits) {
	std::string option;
	bool neverExit =false;
	while (neverExit==false) {
		selectGame_Welcome();
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Choose a game which you want to Play!" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Option: 1 for SuperFire 5" << std::endl;
		std::cout << "Option: 2 for SuperFire 10" << std::endl;
		std::cout << "Option: 3 for Wise Pharaohs 5" << std::endl;
		std::cout << "Option: 4 for Tiger's Battle 10" << std::endl;
		std::cout << "Option: 5 for Keno" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Press a to add credit!" << std::endl;
		std::cout << "Press c to exit!" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cin >> option;

		if (option[0] == 'a' && option.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (option[0] == 'c' && option.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				std::chrono::seconds duration(3);
				std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				std::chrono::seconds duration(3);
				std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (option[0] == '1' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcome();
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBet(bet, credits);

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNow(credits, bet);
		}
		if (option[0] == '2' && option.size() == 1) {
				//clear console
			if (system("CLS")) system("clear");
				//welcome game
				PrintGameName printWelcome;
				printWelcome.PrintGameNameWelcomeSuperFire10();
				//credit
			if (credits < 2) {
					std::cout << "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!" << std::endl;
					std::cout << "----------------------------------------------------------------------" << std::endl;
					CreditField myCredit;
					myCredit.AddCredit(credits);
			}
			
			//bet
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetSuperFire10(bet, credits);

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowSuperFire10(credits, bet);
		}
		// Wise Pharaohs 5 
		if (option[0] == '3' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeWisePharaohs5();
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetWisePharaohs(bet, credits);

			//matrix 2D
			//need to change
			std::vector<std::vector<int>> myMatrixVector;
			MatrixPharaohs myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowWisePharaohs5(credits, bet); 
		}

		if (option[0] == '4' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeTigersBattle10(); // changed
			//credit
			if (credits < 2) {
				std::cout << "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetTigersBattle10(bet, credits); //changed  bet 2 euro

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowTigersBattle10(credits, bet); //changed
		}
		if (option[0] == '5' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeKeno();
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetKeno(bet, credits);

			//matrix 2D
			/*std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);*/

			//starting a game

			Start startGame(credits, bet);
			startGame.StartGameNowKeno(credits, bet);
		}
	}
	return credits;
}